

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgelement.cpp
# Opt level: O2

void __thiscall lunasvg::SVGMaskElement::applyMask(SVGMaskElement *this,SVGRenderState *state)

{
  Transform *this_00;
  SVGClipPathElement *this_01;
  SVGMaskElement *this_02;
  element_type *this_03;
  bool bVar1;
  float tx;
  float ty;
  float sx;
  float sy;
  shared_ptr<lunasvg::Canvas> maskImage;
  Transform currentTransform;
  __shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2> local_78;
  SVGRenderState local_60;
  
  bVar1 = SVGRenderState::hasCycleReference(state,&this->super_SVGElement);
  if (!bVar1) {
    this_00 = &state->m_currentTransform;
    (*(state->m_element->super_SVGNode)._vptr_SVGNode[0xd])();
    local_60._0_16_ = Transform::mapRect(this_00,(Rect *)&currentTransform);
    Canvas::create((Canvas *)&maskImage,(Rect *)&local_60);
    this_03 = maskImage.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_60._0_16_ = maskRect(this,state->m_element);
    sx = local_60.m_parent._0_4_;
    sy = local_60.m_parent._4_4_;
    Canvas::clipRect(this_03,(Rect *)&local_60,NonZero,this_00);
    currentTransform.m_matrix.e = (state->m_currentTransform).m_matrix.e;
    currentTransform.m_matrix.f = (state->m_currentTransform).m_matrix.f;
    currentTransform.m_matrix.a = (this_00->m_matrix).a;
    currentTransform.m_matrix.b = (state->m_currentTransform).m_matrix.b;
    currentTransform.m_matrix.c = (state->m_currentTransform).m_matrix.c;
    currentTransform.m_matrix.d = (state->m_currentTransform).m_matrix.d;
    if ((this->m_maskContentUnits).super_SVGProperty.field_0x9 == '\x01') {
      (*(state->m_element->super_SVGNode)._vptr_SVGNode[0xb])();
      Transform::translate(&currentTransform,tx,ty);
      Transform::scale(&currentTransform,sx,sy);
    }
    std::__shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_78,&maskImage.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>)
    ;
    local_60.m_parent = state;
    local_60.m_element = &this->super_SVGElement;
    local_60.m_currentTransform.m_matrix.b = currentTransform.m_matrix.b;
    local_60.m_currentTransform.m_matrix.a = currentTransform.m_matrix.a;
    local_60.m_currentTransform.m_matrix.d = currentTransform.m_matrix.d;
    local_60.m_currentTransform.m_matrix.c = currentTransform.m_matrix.c;
    local_60.m_currentTransform.m_matrix.e = currentTransform.m_matrix.e;
    local_60.m_currentTransform.m_matrix.f = currentTransform.m_matrix.f;
    local_60.m_mode = Painting;
    local_60.m_canvas.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_78._M_ptr;
    local_60.m_canvas.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = local_78._M_refcount._M_pi;
    local_78._M_ptr = (element_type *)0x0;
    local_78._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
    SVGElement::renderChildren(&this->super_SVGElement,&local_60);
    this_01 = (this->super_SVGElement).m_clipper;
    if (this_01 != (SVGClipPathElement *)0x0) {
      SVGClipPathElement::applyClipMask(this_01,&local_60);
    }
    this_02 = (this->super_SVGElement).m_masker;
    if (this_02 != (SVGMaskElement *)0x0) {
      applyMask(this_02,&local_60);
    }
    if (this->m_mask_type == Luminance) {
      Canvas::convertToLuminanceMask
                (maskImage.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    Canvas::blendCanvas((state->m_canvas).
                        super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        maskImage.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,Dst_In,1.0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&local_60 + 0x38));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&maskImage.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return;
}

Assistant:

void SVGMaskElement::applyMask(SVGRenderState& state) const
{
    if(state.hasCycleReference(this))
        return;
    auto maskImage = Canvas::create(state.currentTransform().mapRect(state.paintBoundingBox()));
    maskImage->clipRect(maskRect(state.element()), FillRule::NonZero, state.currentTransform());

    auto currentTransform = state.currentTransform();
    if(m_maskContentUnits.value() == Units::ObjectBoundingBox) {
        auto bbox = state.fillBoundingBox();
        currentTransform.translate(bbox.x, bbox.y);
        currentTransform.scale(bbox.w, bbox.h);
    }

    SVGRenderState newState(this, &state, currentTransform, SVGRenderMode::Painting, maskImage);
    renderChildren(newState);
    if(clipper())
        clipper()->applyClipMask(newState);
    if(masker()) {
        masker()->applyMask(newState);
    }

    if(m_mask_type == MaskType::Luminance)
        maskImage->convertToLuminanceMask();
    state->blendCanvas(*maskImage, BlendMode::Dst_In, 1.f);
}